

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O0

Vec_Int_t * Gia_RsbCiWindow(Gia_Man_t *p,int nPis)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vMap_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar2;
  Vec_Wec_t *vLevels;
  Vec_Int_t *vMap;
  Vec_Int_t *vNodes;
  int iMaxFan;
  int i;
  Vec_Int_t *vRes;
  int nPis_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum(p);
  vMap_00 = Vec_IntStartFull(iVar1);
  iVar1 = Gia_ManLevelNum(p);
  p_01 = Vec_WecStart(iVar1 + 1);
  Gia_ManStaticFanoutStart(p);
  Gia_ManIncrementTravId(p);
  iVar1 = Gia_WinAddCiWithMaxFanouts(p);
  Gia_ObjSetTravIdCurrentId(p,iVar1);
  Vec_IntPush(p_00,iVar1);
  for (vNodes._4_4_ = 1; vNodes._4_4_ < nPis; vNodes._4_4_ = vNodes._4_4_ + 1) {
    iVar1 = Gia_WinAddCiWithMaxDivisors(p,p_01);
    Gia_WinTryAddingNode(p,iVar1,-1,p_01,p_00);
  }
  Vec_IntSort(p_00,0);
  pVVar2 = Gia_RsbCiTranslate(p,p_00,vMap_00);
  Gia_ManStaticFanoutStop(p);
  Vec_WecFree(p_01);
  Vec_IntFree(vMap_00);
  Vec_IntFree(p_00);
  return pVVar2;
}

Assistant:

Vec_Int_t * Gia_RsbCiWindow( Gia_Man_t * p, int nPis )
{
    Vec_Int_t * vRes;  int i, iMaxFan;
    Vec_Int_t * vNodes  = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap    = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Wec_t * vLevels = Vec_WecStart( Gia_ManLevelNum(p)+1 );
    Gia_ManStaticFanoutStart( p );
    Gia_ManIncrementTravId(p);
    // add the first one
    iMaxFan = Gia_WinAddCiWithMaxFanouts( p );
    Gia_ObjSetTravIdCurrentId( p, iMaxFan );
    Vec_IntPush( vNodes, iMaxFan );
    // add remaining ones
    for ( i = 1; i < nPis; i++ )
    {
        iMaxFan = Gia_WinAddCiWithMaxDivisors( p, vLevels );
        Gia_WinTryAddingNode( p, iMaxFan, -1, vLevels, vNodes );
    }
    Vec_IntSort( vNodes, 0 );
    vRes = Gia_RsbCiTranslate( p, vNodes, vMap );
    Gia_ManStaticFanoutStop( p );
    Vec_WecFree( vLevels );
    Vec_IntFree( vMap );
//Vec_IntPrint( vNodes );
    Vec_IntFree( vNodes );
    return vRes;
}